

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O1

bool __thiscall tf::Executor::_invoke_dependent_async_task(Executor *this,Worker *worker,Node *node)

{
  __index_type _Var1;
  char cVar2;
  bool bVar3;
  undefined8 uVar4;
  Worker *pWVar5;
  _Any_data *p_Var6;
  _Any_data *work;
  _Hash_node_base *p_Var7;
  
  _Var1 = (node->_handle).
          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          ._M_index;
  work = (_Any_data *)0x0;
  if (_Var1 == '\b') {
    work = (_Any_data *)&node->_handle;
  }
  cVar2 = work[2]._M_pod_data[0];
  if (cVar2 == '\x02') {
    bVar3 = _invoke_runtime_task_impl
                      (this,worker,node,(function<void_(tf::Runtime_&,_bool)> *)work->_M_pod_data);
  }
  else {
    if (cVar2 != '\x01') {
      if (cVar2 != '\0') {
        return false;
      }
      pWVar5 = worker;
      for (p_Var7 = (this->_observers)._M_h._M_before_begin._M_nxt; p_Var7 != (_Hash_node_base *)0x0
          ; p_Var7 = p_Var7->_M_nxt) {
        pWVar5 = worker;
        (*(code *)(p_Var7[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var7[1]._M_nxt,worker,node);
      }
      p_Var6 = (_Any_data *)0x0;
      if ((_Var1 == '\b') && (work[2]._M_pod_data[0] == '\0')) {
        p_Var6 = work;
      }
      if (*(long *)(p_Var6 + 1) == 0) {
        uVar4 = std::__throw_bad_function_call();
        __cxa_begin_catch(uVar4);
        _process_exception(this,worker,node);
        __cxa_end_catch();
      }
      else {
        (**(code **)((long)p_Var6 + 0x18))(p_Var6,(Runtime *)pWVar5);
      }
      for (p_Var7 = (this->_observers)._M_h._M_before_begin._M_nxt; p_Var7 != (_Hash_node_base *)0x0
          ; p_Var7 = p_Var7->_M_nxt) {
        (*(code *)(p_Var7[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var7[1]._M_nxt,worker,node);
      }
      return false;
    }
    bVar3 = _invoke_runtime_task_impl(this,worker,node,(function<void_(tf::Runtime_&)> *)work);
  }
  if (bVar3 == false) {
    return false;
  }
  return true;
}

Assistant:

inline bool Executor::_invoke_dependent_async_task(Worker& worker, Node* node) {
  auto& work = std::get_if<Node::DependentAsync>(&node->_handle)->work;
  switch(work.index()) {
    // void()
    case 0:
      _observer_prologue(worker, node);
      TF_EXECUTOR_EXCEPTION_HANDLER(worker, node, {
        std::get_if<0>(&work)->operator()();
      });
      _observer_epilogue(worker, node);
    break;
    
    // void(Runtime&) - silent async
    case 1:
      if(_invoke_runtime_task_impl(worker, node, *std::get_if<1>(&work))) {
        return true;
      }
    break;

    // void(Runtime&, bool) - async
    case 2:
      if(_invoke_runtime_task_impl(worker, node, *std::get_if<2>(&work))) {
        return true;
      }
    break;
  }
  return false;
}